

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framer.h
# Opt level: O2

void __thiscall Framer::~Framer(Framer *this)

{
  ostream *poVar1;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  poVar1 = std::operator<<((ostream *)&std::cout,"------------------");
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct((ulong)local_30,(char)this->m_length_);
  poVar1 = std::operator<<(poVar1,(string *)local_30);
  std::operator<<(poVar1,"------------------\n");
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

~Framer()
    {
        std::cout << "------------------" << std::string(m_length_, '-')
                  << "------------------\n";
    }